

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O0

void Wlc_WinCompute(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vLeaves,Vec_Int_t *vNodes)

{
  int iVar1;
  Wlc_Obj_t *pWVar2;
  int local_34;
  int i;
  Wlc_Obj_t *pFanin;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vLeaves_local;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  Vec_IntClear(vLeaves);
  Vec_IntClear(vNodes);
  iVar1 = Wlc_ObjHasArithm_rec(p,pObj);
  if (iVar1 == 0) {
    iVar1 = Wlc_ObjHasArithmFanins(p,pObj);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcWin.c"
                    ,0x82,"void Wlc_WinCompute(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Int_t *, Vec_Int_t *)")
      ;
    }
    for (local_34 = 0; iVar1 = Wlc_ObjFaninNum(pObj), local_34 < iVar1; local_34 = local_34 + 1) {
      iVar1 = Wlc_ObjFaninId(pObj,local_34);
      pWVar2 = Wlc_NtkObj(p,iVar1);
      iVar1 = Wlc_ObjHasArithm_rec(p,pWVar2);
      if (iVar1 != 0) {
        Wlc_WinCompute_rec(p,pWVar2,vLeaves,vNodes);
      }
    }
    for (local_34 = 0; iVar1 = Wlc_ObjFaninNum(pObj), local_34 < iVar1; local_34 = local_34 + 1) {
      iVar1 = Wlc_ObjFaninId(pObj,local_34);
      pWVar2 = Wlc_NtkObj(p,iVar1);
      iVar1 = Wlc_ObjHasArithm_rec(p,pWVar2);
      if (iVar1 != 0) {
        Wlc_WinCleanMark_rec(p,pWVar2);
      }
    }
  }
  else {
    Wlc_WinCompute_rec(p,pObj,vLeaves,vNodes);
    Wlc_WinCleanMark_rec(p,pObj);
  }
  return;
}

Assistant:

void Wlc_WinCompute( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vLeaves, Vec_Int_t * vNodes )
{
    Vec_IntClear( vLeaves );
    Vec_IntClear( vNodes );
    if ( Wlc_ObjHasArithm_rec(p, pObj) )
    {
        Wlc_WinCompute_rec( p, pObj, vLeaves, vNodes );
        Wlc_WinCleanMark_rec( p, pObj );
    }
    else if ( Wlc_ObjHasArithmFanins(p, pObj) )
    {
        Wlc_Obj_t * pFanin;  int i;
        Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
            if ( Wlc_ObjHasArithm_rec(p, pFanin) )
                Wlc_WinCompute_rec( p, pFanin, vLeaves, vNodes );
        Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
            if ( Wlc_ObjHasArithm_rec(p, pFanin) )
                Wlc_WinCleanMark_rec( p, pFanin );
    }
    else assert( 0 );
}